

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

bool __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::isValidRethrow(wasm::Name_
          (void *this,Name target)

{
  bool bVar1;
  Expression **ppEVar2;
  size_t sVar3;
  Try *pTVar4;
  Expression *child;
  Try *tryy;
  Expression *curr;
  Index i;
  Fixer *this_local;
  Name target_local;
  
  target_local.super_IString.str._M_len = target.super_IString.str._M_str;
  this_local = target.super_IString.str._M_len;
  bVar1 = SmallVector<wasm::Expression_*,_10UL>::empty
                    ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!expressionStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x786,
                  "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::isValidRethrow(Name)"
                 );
  }
  ppEVar2 = SmallVector<wasm::Expression_*,_10UL>::back
                      ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
  bVar1 = Expression::is<wasm::Rethrow>(*ppEVar2);
  if (!bVar1) {
    __assert_fail("expressionStack.back()->is<Rethrow>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x787,
                  "bool wasm::TranslateToFuzzReader::fixAfterChanges(Function *)::Fixer::isValidRethrow(Name)"
                 );
  }
  sVar3 = SmallVector<wasm::Expression_*,_10UL>::size
                    ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
  if (1 < sVar3) {
    sVar3 = SmallVector<wasm::Expression_*,_10UL>::size
                      ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
    curr._4_4_ = (int)sVar3 - 2;
    while( true ) {
      ppEVar2 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                          ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8),
                           (ulong)curr._4_4_);
      pTVar4 = Expression::dynCast<wasm::Try>(*ppEVar2);
      if ((pTVar4 != (Try *)0x0) &&
         (bVar1 = IString::operator==(&(pTVar4->name).super_IString,(IString *)&this_local), bVar1))
      {
        sVar3 = SmallVector<wasm::Expression_*,_10UL>::size
                          ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8));
        if (curr._4_4_ + 1 < sVar3) {
          ppEVar2 = SmallVector<wasm::Expression_*,_10UL>::operator[]
                              ((SmallVector<wasm::Expression_*,_10UL> *)((long)this + 0xd8),
                               (ulong)(curr._4_4_ + 1));
          return *ppEVar2 != pTVar4->body;
        }
        return false;
      }
      if (curr._4_4_ == 0) break;
      curr._4_4_ = curr._4_4_ - 1;
    }
  }
  return false;
}

Assistant:

bool isValidRethrow(Name target) {
      // The rethrow must be on top.
      assert(!expressionStack.empty());
      assert(expressionStack.back()->is<Rethrow>());
      if (expressionStack.size() < 2) {
        // There must be a try for this rethrow to be valid.
        return false;
      }
      Index i = expressionStack.size() - 2;
      while (1) {
        auto* curr = expressionStack[i];
        if (auto* tryy = curr->dynCast<Try>()) {
          // The rethrow must target a try, and must be nested in a catch of
          // that try (not the body). Look at the child above us to check, when
          // we find the proper try.
          if (tryy->name == target) {
            if (i + 1 >= expressionStack.size()) {
              return false;
            }
            auto* child = expressionStack[i + 1];
            return child != tryy->body;
          }
        }
        if (i == 0) {
          // We never found our try.
          return false;
        }
        i--;
      }
    }